

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

void __thiscall Container::cleanup_root(Container *this)

{
  pointer pcVar1;
  path *ppVar2;
  ContextManager *pCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  error_code error;
  directory_iterator local_c0;
  directory_iterator local_b0;
  error_code local_a0;
  path local_90;
  path local_68;
  path *local_40;
  Container *local_38;
  
  local_a0._M_value = 0;
  local_a0._M_cat = (error_category *)std::_V2::system_category();
  local_40 = &this->work_dir_;
  local_38 = this;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_b0,local_40,none,(error_code *)0x0);
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_c0._M_dir._M_ptr = local_b0._M_dir._M_ptr;
  local_c0._M_dir._M_refcount._M_pi = local_b0._M_dir._M_refcount._M_pi;
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0._M_dir._M_refcount._M_pi);
    }
  }
  while (local_c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_c0);
    std::filesystem::remove_all(ppVar2,&local_a0);
    if (local_a0._M_value != 0) {
      pCVar3 = ContextManager::get();
      pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_90,local_a0._M_cat,local_a0._M_value);
      format_abi_cxx11_(&local_68._M_pathname,"Cannot remove %s: %s",pcVar1);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_pathname._M_dataplus._M_p != &local_68._M_pathname.field_2) {
        operator_delete(local_68._M_pathname._M_dataplus._M_p,
                        local_68._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_pathname._M_dataplus._M_p != &local_90._M_pathname.field_2) {
        operator_delete(local_90._M_pathname._M_dataplus._M_p,
                        local_90._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_c0);
  }
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_dir._M_refcount._M_pi)
    ;
  }
  ppVar2 = &local_38->root_;
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            (&local_90,(char (*) [4])"tmp",auto_format);
  std::filesystem::__cxx11::operator/(&local_68,ppVar2,&local_90);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_b0,&local_68,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::path::~path(&local_90);
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_c0._M_dir._M_ptr = local_b0._M_dir._M_ptr;
  local_c0._M_dir._M_refcount._M_pi = local_b0._M_dir._M_refcount._M_pi;
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0._M_dir._M_refcount._M_pi);
    }
  }
  while (local_c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_c0);
    std::filesystem::remove_all(ppVar2,&local_a0);
    if (local_a0._M_value != 0) {
      pCVar3 = ContextManager::get();
      pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_90,local_a0._M_cat,local_a0._M_value);
      format_abi_cxx11_(&local_68._M_pathname,"Cannot remove %s: %s",pcVar1);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_pathname._M_dataplus._M_p != &local_68._M_pathname.field_2) {
        operator_delete(local_68._M_pathname._M_dataplus._M_p,
                        local_68._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_pathname._M_dataplus._M_p != &local_90._M_pathname.field_2) {
        operator_delete(local_90._M_pathname._M_dataplus._M_p,
                        local_90._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_c0);
  }
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_dir._M_refcount._M_pi)
    ;
  }
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_b0,local_40,none,(error_code *)0x0);
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_c0._M_dir._M_ptr = local_b0._M_dir._M_ptr;
  local_c0._M_dir._M_refcount._M_pi = local_b0._M_dir._M_refcount._M_pi;
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b0._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0._M_dir._M_refcount._M_pi);
    }
  }
  while (local_c0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_c0);
    std::filesystem::remove_all(ppVar2,&local_a0);
    if (local_a0._M_value != 0) {
      pCVar3 = ContextManager::get();
      pcVar1 = (ppVar2->_M_pathname)._M_dataplus._M_p;
      (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_90,local_a0._M_cat,local_a0._M_value);
      format_abi_cxx11_(&local_68._M_pathname,"Cannot remove %s: %s",pcVar1,
                        local_90._M_pathname._M_dataplus._M_p);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_pathname._M_dataplus._M_p != &local_68._M_pathname.field_2) {
        operator_delete(local_68._M_pathname._M_dataplus._M_p,
                        local_68._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_pathname._M_dataplus._M_p != &local_90._M_pathname.field_2) {
        operator_delete(local_90._M_pathname._M_dataplus._M_p,
                        local_90._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_c0);
  }
  if (local_b0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_dir._M_refcount._M_pi)
    ;
  }
  return;
}

Assistant:

void Container::cleanup_root() {
    std::error_code error;
    for (const auto &path : fs::directory_iterator(work_dir_)) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }

    for (const auto &path : fs::directory_iterator(root_ / "tmp")) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }

    for (const auto &path : fs::directory_iterator(work_dir_)) {
        fs::remove_all(path, error);
        if (error) {
            die(format("Cannot remove %s: %s", path.path().c_str(), error.message().c_str()));
        }
    }
}